

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

ssize_t __thiscall Process::Arguments::read(Arguments *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  char **ppcVar4;
  long *plVar5;
  long *extraout_RAX;
  String *extraout_RAX_00;
  long *extraout_RAX_01;
  String *extraout_RAX_02;
  String *pSVar6;
  char *pcVar7;
  long *extraout_RAX_03;
  long *extraout_RAX_04;
  char *pcVar8;
  int iVar9;
  long lVar10;
  char cVar11;
  undefined4 in_register_00000034;
  int *piVar12;
  Option *pOVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  usize uVar18;
  bool bVar19;
  
  piVar12 = (int *)CONCAT44(in_register_00000034,__fd);
  if (*this->arg == '\0') {
    ppcVar4 = this->argv;
    if (this->argvEnd <= ppcVar4) {
      return 0;
    }
    this->argv = ppcVar4 + 1;
    this->arg = *ppcVar4;
    this->inOpt = false;
  }
  else {
    this->arg = this->arg + 1;
  }
  if (((this->inOpt == false) && (this->skipOpt == false)) && (pcVar14 = this->arg, *pcVar14 == '-')
     ) {
    pcVar15 = pcVar14 + 1;
    if (pcVar14[1] == '-') {
      pcVar7 = pcVar14 + 2;
      this->arg = pcVar7;
      cVar11 = pcVar14[2];
      pcVar8 = pcVar7;
      if (cVar11 != '\0') {
        do {
          if (cVar11 == '=') goto LAB_00104d36;
          cVar11 = pcVar8[1];
          pcVar8 = pcVar8 + 1;
        } while (cVar11 != '\0');
        pcVar8 = (char *)0x0;
LAB_00104d36:
        pcVar17 = pcVar8;
        if (pcVar8 == (char *)0x0) {
          do {
            pcVar17 = pcVar15 + 1;
            pcVar1 = pcVar15 + 1;
            pcVar15 = pcVar17;
          } while (*pcVar1 != '\0');
        }
        pOVar13 = this->options;
        if (pOVar13 < this->optionsEnd) {
          lVar10 = (long)pcVar17 - (long)pcVar7;
LAB_00104d5e:
          pcVar15 = pOVar13->name;
          if (pcVar15 == (char *)0x0) goto LAB_00104d9c;
          pcVar1 = pcVar15 + lVar10;
          pcVar16 = pcVar7;
          if (0 < lVar10) {
            do {
              cVar11 = *pcVar15;
              if ((cVar11 == '\0') || (cVar11 != *pcVar16)) {
                if (cVar11 != *pcVar16) goto LAB_00104d9c;
                break;
              }
              pcVar15 = pcVar15 + 1;
              pcVar16 = pcVar16 + 1;
            } while (pcVar15 < pcVar1);
          }
          if (*pcVar1 != '\0') goto LAB_00104d9c;
          pcVar7 = pcVar7 + ((lVar10 + 1) - (ulong)(pcVar8 == (char *)0x0));
          *piVar12 = pOVar13->character;
          this->arg = pcVar7;
          uVar3 = pOVar13->flags;
          if ((uVar3 & 1) != 0) {
            if (pcVar8 == (char *)0x0) {
              if ((uVar3 & 2) != 0) goto LAB_00105023;
              if (*pcVar7 == '\0') {
                ppcVar4 = this->argv;
                if (this->argvEnd <= ppcVar4) {
                  if ((uVar3 & 2) != 0) goto LAB_00105023;
                  String::attach((String *)__buf,pcVar14,lVar10 + 2);
                  *piVar12 = 0x3a;
                  plVar5 = extraout_RAX_04;
                  goto LAB_00104fc8;
                }
                this->argv = ppcVar4 + 1;
                this->arg = *ppcVar4;
                this->inOpt = false;
              }
              else {
                this->arg = pcVar7 + 1;
              }
            }
            pcVar14 = this->arg;
            uVar18 = 0xffffffffffffffff;
            do {
              lVar10 = uVar18 + 1;
              uVar18 = uVar18 + 1;
            } while (pcVar14[lVar10] != '\0');
            goto LAB_00104f1a;
          }
LAB_00105023:
          String::clear((String *)__buf);
          plVar5 = extraout_RAX_03;
          goto LAB_00104fc8;
        }
LAB_00104da5:
        *piVar12 = 0x3f;
        pcVar17 = pcVar17 + ~(ulong)pcVar14;
        do {
          pcVar14 = this->arg + -1 + (long)pcVar17;
          pcVar17 = pcVar17 + 1;
        } while (*pcVar14 != '\0');
        String::attach((String *)__buf,this->arg + -2,(usize)pcVar17);
        plVar5 = (long *)(this->arg + (long)pcVar17 + -2);
        this->arg = (char *)plVar5;
        goto LAB_00104fc8;
      }
      this->skipOpt = true;
      if (*pcVar7 == '\0') {
        ppcVar4 = this->argv;
        if (this->argvEnd <= ppcVar4) {
          return 0;
        }
        this->argv = ppcVar4 + 1;
        this->arg = *ppcVar4;
        this->inOpt = false;
      }
      else {
        this->arg = pcVar14 + 3;
      }
    }
    else {
      this->arg = pcVar15;
      if (*pcVar15 == '\0') {
        *piVar12 = 0;
        String::attach((String *)__buf,pcVar14,1);
        plVar5 = extraout_RAX;
        goto LAB_00104fc8;
      }
      this->inOpt = true;
    }
  }
  if (this->inOpt != true) {
    *piVar12 = 0;
    pcVar14 = this->arg;
    uVar18 = 0xffffffffffffffff;
    do {
      lVar10 = uVar18 + 1;
      uVar18 = uVar18 + 1;
    } while (pcVar14[lVar10] != '\0');
LAB_00104f1a:
    String::attach((String *)__buf,pcVar14,uVar18);
    this->arg = this->arg + uVar18;
    plVar5 = extraout_RAX_01;
    goto LAB_00104fc8;
  }
  pcVar15 = this->arg;
  pcVar14 = pcVar15 + 1;
  this->arg = pcVar14;
  iVar9 = (int)*pcVar15;
  *piVar12 = iVar9;
  pOVar13 = this->options;
  bVar19 = pOVar13 < this->optionsEnd;
  if (bVar19) {
    iVar2 = pOVar13->character;
    while (iVar2 != iVar9) {
      pOVar13 = pOVar13 + 1;
      bVar19 = pOVar13 < this->optionsEnd;
      if (!bVar19) goto LAB_00104f48;
      iVar2 = pOVar13->character;
    }
    if ((pOVar13->flags & 3) == 1) {
      if (*pcVar14 == '\0') {
        ppcVar4 = this->argv;
        if (this->argvEnd <= ppcVar4) {
          String::clear((String *)__buf);
          String::append((String *)__buf,'-');
          pSVar6 = String::append((String *)__buf,(char)*piVar12);
          *piVar12 = 0x3a;
          goto LAB_00104f3d;
        }
        this->argv = ppcVar4 + 1;
        this->arg = *ppcVar4;
        this->inOpt = false;
      }
      uVar18 = 0xffffffffffffffff;
      do {
        lVar10 = uVar18 + 1;
        uVar18 = uVar18 + 1;
      } while (this->arg[lVar10] != '\0');
      String::attach((String *)__buf,this->arg,uVar18);
      this->arg = this->arg + uVar18;
      pSVar6 = extraout_RAX_00;
    }
    else {
      String::clear((String *)__buf);
      pSVar6 = extraout_RAX_02;
    }
LAB_00104f3d:
    if (bVar19) {
      return CONCAT71((int7)((ulong)pSVar6 >> 8),1);
    }
  }
LAB_00104f48:
  String::clear((String *)__buf);
  uVar18 = *(usize *)(*__buf + 8);
  String::detach((String *)__buf,uVar18,uVar18 + 1);
  *(undefined1 *)(**__buf + (*__buf)[1]) = 0x2d;
  plVar5 = *__buf;
  plVar5[1] = uVar18 + 1;
  *(undefined1 *)(*plVar5 + 1 + uVar18) = 0;
  iVar9 = *piVar12;
  uVar18 = *(usize *)(*__buf + 8);
  String::detach((String *)__buf,uVar18,uVar18 + 1);
  *(char *)(**__buf + (*__buf)[1]) = (char)iVar9;
  plVar5 = *__buf;
  plVar5[1] = uVar18 + 1;
  *(undefined1 *)(*plVar5 + 1 + uVar18) = 0;
  *piVar12 = 0x3f;
LAB_00104fc8:
  return CONCAT71((int7)((ulong)plVar5 >> 8),1);
LAB_00104d9c:
  pOVar13 = pOVar13 + 1;
  if (this->optionsEnd <= pOVar13) goto LAB_00104da5;
  goto LAB_00104d5e;
}

Assistant:

bool Process::Arguments::read(int& character, String& argument)
{
  if(!nextChar())
    return false;

  if(!inOpt && !skipOpt)
  {
    if(*arg == '-')
    {
      if(arg[1] == '-')
      { // handel '--' arg
        arg += 2;
        if(!*arg)
        {
          skipOpt = true;
          if(!nextChar())
            return false;
        }
        else
        {
          const char* end = String::find(arg, '=');
          usize argLen = end ? end - arg : String::length(arg);
          for(const Option* opt = options; opt < optionsEnd; ++opt)
            if(opt->name && String::compare(opt->name, arg, argLen) == 0 && !opt->name[argLen])
            {
              const char* argName = arg;
              character = opt->character;
              arg += end ? argLen + 1 : argLen;
              if(opt->flags & Process::argumentFlag)
              {
                if(end || (!(opt->flags & Process::optionalFlag) && nextChar()))
                {
                  usize len = String::length(arg);
                  argument.attach(arg, len);
                  arg += len;
                  return true;
                }
                if(!(opt->flags & Process::optionalFlag))
                {
                  // missing argument
                  argument.attach(argName - 2, argLen + 2);
                  character = ':';
                  return true;
                }
              }
              argument.clear();
              return true;
            }

          // unknown option
          character = '?';
          argLen += String::length(arg + argLen);
          argument.attach(arg - 2, argLen + 2);
          arg += argLen;
          return true;
        }
      }
      else
      {
        if(!*(++arg))
        {
          character = 0;
          argument.attach(arg - 1, 1); // "-"
          return true;
        }
        inOpt = true;
      }
    }
  }

  // find option *str
  if(inOpt)
  {
    character = *(arg++);
    for(const Option* opt = options; opt < optionsEnd; ++opt)
      if(opt->character == character)
      {
        if(opt->flags & Process::argumentFlag && !(opt->flags & Process::optionalFlag))
        {
          if(!*arg)
          {
            if(!nextChar())
            { // missing argument
              argument.clear();
              argument.append('-');
              argument.append((char)character);
              character = ':';
              return true;
            }
          }
          usize len = String::length(arg);
          argument.attach(arg, len);
          arg += len;
          return true;
        }
        argument.clear();
        return true;
      }

    // unknown option
    argument.clear();
    argument.append('-');
    argument.append((char)character);
    character = '?';
    return true;
  }

  // non option argument
  character = '\0';
  usize len = String::length(arg);
  argument.attach(arg, len);
  arg += len;
  return true;
}